

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::CommissionerSafe::SetSecurePendingDataset
          (Error *__return_storage_ptr__,CommissionerSafe *this,uint32_t aMaxRetrievalTimer,
          PendingOperationalDataset *aDataset)

{
  promise<ot::commissioner::Error> pro;
  __basic_future<ot::commissioner::Error> local_70;
  promise<ot::commissioner::Error> local_60;
  promise<ot::commissioner::Error> *local_48;
  undefined8 local_40;
  code *local_38;
  code *local_30;
  
  std::promise<ot::commissioner::Error>::promise(&local_60);
  local_40 = 0;
  local_30 = std::
             _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:391:32)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:391:32)>
             ::_M_manager;
  local_48 = &local_60;
  (*(this->super_Commissioner)._vptr_Commissioner[0x23])
            (this,&local_48,(ulong)aMaxRetrievalTimer,aDataset);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  std::__basic_future<ot::commissioner::Error>::__basic_future(&local_70,&local_60._M_future);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&local_70);
  if (local_70._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<ot::commissioner::Error>::~promise(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::SetSecurePendingDataset(uint32_t aMaxRetrievalTimer, const PendingOperationalDataset &aDataset)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error aError) { pro.set_value(aError); };

    SetSecurePendingDataset(wait, aMaxRetrievalTimer, aDataset);
    return pro.get_future().get();
}